

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O2

State * __thiscall
Problem::getStateFromBidNumbers
          (State *__return_storage_ptr__,Problem *this,vector<int,_std::allocator<int>_> *bidNos)

{
  int numConflicts;
  double cost;
  _Vector_base<int,_std::allocator<int>_> local_70;
  _Vector_base<int,_std::allocator<int>_> local_58;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_40,bidNos);
  cost = getStateCost(this,(vector<int,_std::allocator<int>_> *)&local_40);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_58,bidNos);
  numConflicts = getStateConflicts(this,(vector<int,_std::allocator<int>_> *)&local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_70,bidNos);
  State::State(__return_storage_ptr__,(vector<int,_std::allocator<int>_> *)&local_70,cost,
               numConflicts);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_70);
  return __return_storage_ptr__;
}

Assistant:

State Problem::getStateFromBidNumbers(vector<int> bidNos) {
    // cout<<"Getting state"<<endl;
    double totalCost = getStateCost(bidNos);
    // cout<<"Cost: "<<to_string(totalCost)<<", ";
    int totalConflicts = getStateConflicts(bidNos);
    // cout<<"Conflicts: "<<totalConflicts<<endl;
    return State(bidNos, totalCost, totalConflicts);
}